

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O2

void __thiscall cs::statement_try::dump(statement_try *this,ostream *o)

{
  _Elt_pointer ppsVar1;
  ostream *poVar2;
  _Elt_pointer ppsVar3;
  _Map_pointer pppsVar4;
  statement_base **ptr;
  _Elt_pointer ppsVar5;
  
  std::operator<<(o,"< Try >\n");
  ppsVar5 = (this->mTryBody).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  ppsVar3 = (this->mTryBody).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_last;
  pppsVar4 = (this->mTryBody).
             super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
             super__Deque_impl_data._M_start._M_node;
  ppsVar1 = (this->mTryBody).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  while (ppsVar5 != ppsVar1) {
    (*(*ppsVar5)->_vptr_statement_base[5])(*ppsVar5,o);
    ppsVar5 = ppsVar5 + 1;
    if (ppsVar5 == ppsVar3) {
      ppsVar5 = pppsVar4[1];
      pppsVar4 = pppsVar4 + 1;
      ppsVar3 = ppsVar5 + 0x40;
    }
  }
  poVar2 = std::operator<<(o,"< Catch: ID = \"");
  poVar2 = std::operator<<(poVar2,(string *)&this->mName);
  std::operator<<(poVar2,"\" >\n");
  ppsVar5 = (this->mCatchBody).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  ppsVar3 = (this->mCatchBody).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_last;
  pppsVar4 = (this->mCatchBody).
             super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
             super__Deque_impl_data._M_start._M_node;
  ppsVar1 = (this->mCatchBody).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  while (ppsVar5 != ppsVar1) {
    (*(*ppsVar5)->_vptr_statement_base[5])(*ppsVar5,o);
    ppsVar5 = ppsVar5 + 1;
    if (ppsVar5 == ppsVar3) {
      ppsVar5 = pppsVar4[1];
      pppsVar4 = pppsVar4 + 1;
      ppsVar3 = ppsVar5 + 0x40;
    }
  }
  std::operator<<(o,"< EndTry >\n");
  return;
}

Assistant:

void statement_try::dump(std::ostream &o) const
	{
		o << "< Try >\n";
		for (auto &ptr: mTryBody)
			ptr->dump(o);
		o << "< Catch: ID = \"" << mName << "\" >\n";
		for (auto &ptr: mCatchBody)
			ptr->dump(o);
		o << "< EndTry >\n";
	}